

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall Server::sendFriendList(Server *this)

{
  uint32_t friendNumber;
  Tox *pTVar1;
  long lVar2;
  _Alloc_hider _Var3;
  ulong uVar4;
  int i;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  undefined8 uStack_80;
  uint32_t auStack_78 [4];
  ulong uStack_68;
  TOX_ERR_FRIEND_SEND_MESSAGE sendError;
  undefined1 *local_60;
  string local_58;
  uint32_t local_38;
  uint32_t local_34;
  
  uStack_80 = 0x10b3c4;
  uVar4 = tox_self_get_friend_list_size(this->tox);
  if (uVar4 < 2) {
    uStack_80 = 0x10b4ae;
    tox_friend_send_message(this->tox,this->redirectionFriendNumber,0,"32",2,auStack_78 + 3);
    if (auStack_78[3] == 0) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      uStack_80 = 0x10b500;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Sent empty friend list message","");
      uStack_80 = 0x10b50c;
      writeToLog(this,&local_58);
    }
    else {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      uStack_80 = 0x10b4d3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Failed to send empty friend list message","");
      uStack_80 = 0x10b4df;
      writeToLog(this,&local_58);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      uStack_80 = 0x10b51a;
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  else {
    lVar2 = -(uVar4 * 4 + 0xf & 0xfffffffffffffff0);
    pTVar1 = this->tox;
    local_60 = (undefined1 *)auStack_78;
    *(undefined8 *)((long)auStack_78 + lVar2 + -8) = 0x10b3f5;
    tox_self_get_friend_list(pTVar1,(long)auStack_78 + lVar2);
    uStack_68 = uVar4 - 1;
    local_38 = *(uint32_t *)((long)auStack_78 + uVar4 * 4 + lVar2 + -4);
    local_34 = this->redirectionFriendNumber;
    uVar5 = 0;
    do {
      friendNumber = *(uint32_t *)((long)auStack_78 + lVar2 + uVar5 * 4);
      if (friendNumber != this->redirectionFriendNumber) {
        bVar6 = local_38 == local_34;
        bVar7 = uStack_68 == uVar5;
        *(undefined8 *)((long)auStack_78 + lVar2 + -8) = 0x10b443;
        sendFriendUpdate(this,friendNumber,(uVar4 - 2 == uVar5 && bVar6 || bVar7) | FRIENDLIST_ITEM)
        ;
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    *(undefined8 *)((long)auStack_78 + lVar2 + -8) = 0x10b46a;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Sent friend list","");
    *(undefined8 *)((long)auStack_78 + lVar2 + -8) = 0x10b476;
    writeToLog(this,&local_58);
    _Var3._M_p = local_58._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      *(undefined8 *)((long)auStack_78 + lVar2 + -8) = 0x10b484;
      operator_delete(_Var3._M_p);
    }
  }
  return;
}

Assistant:

void Server::sendFriendList() {
    size_t friendCount = tox_self_get_friend_list_size(tox);

    if (friendCount > 1) { //When friendCount == 1, the only friend which exists is the client
        uint32_t friendList[friendCount];
        tox_self_get_friend_list(tox, friendList);

        bool redirectionIsLast = (friendList[friendCount - 1] == redirectionFriendNumber);

        for (int i = 0; i < friendCount; i++) {
            uint32_t friendNumber = friendList[i];

            if (friendNumber != redirectionFriendNumber) {
                sendFriendUpdate(friendNumber, (i == friendCount - 1 || (redirectionIsLast && i == friendCount - 2)) ? FRIENDLIST_END : FRIENDLIST_ITEM);
            }
        }

        writeToLog("Sent friend list");
    } else {
        TOX_ERR_FRIEND_SEND_MESSAGE sendError;
        tox_friend_send_message(tox, redirectionFriendNumber, TOX_MESSAGE_TYPE_NORMAL, (uint8_t *) "32", 2, &sendError);

        bool success = (sendError == TOX_ERR_FRIEND_SEND_MESSAGE_OK);

        if (success) {
            writeToLog("Sent empty friend list message");
        } else {
            writeToLog("Failed to send empty friend list message");
        }
    }
}